

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_ComponentStatus __thiscall ON_SubDComponentPtr::Status(ON_SubDComponentPtr *this)

{
  Type TVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDFace *pOVar4;
  ON_SubDFace *face;
  ON_SubDEdge *edge;
  ON_SubDVertex *vertex;
  ON_SubDComponentPtr *this_local;
  
  TVar1 = ComponentType(this);
  switch(TVar1) {
  case Unset:
    break;
  case Vertex:
    pOVar2 = Vertex(this);
    if (pOVar2 != (ON_SubDVertex *)0x0) {
      return (pOVar2->super_ON_SubDComponentBase).m_status;
    }
    break;
  case Edge:
    pOVar3 = Edge(this);
    if (pOVar3 != (ON_SubDEdge *)0x0) {
      return (pOVar3->super_ON_SubDComponentBase).m_status;
    }
    break;
  case Face:
    pOVar4 = Face(this);
    if (pOVar4 != (ON_SubDFace *)0x0) {
      return (pOVar4->super_ON_SubDComponentBase).m_status;
    }
  }
  return ON_ComponentStatus::NoneSet;
}

Assistant:

const ON_ComponentStatus ON_SubDComponentPtr::Status() const
{
  switch (ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = Vertex();
      if ( nullptr != vertex )
        return vertex->m_status;
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = Edge();
      if ( nullptr != edge )
        return edge->m_status;
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = Face();
      if ( nullptr != face )
        return face->m_status;
    }
    break;
  case ON_SubDComponentPtr::Type::Unset:
    break;
  }
  return ON_ComponentStatus::NoneSet;
}